

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void output_requires(string *section,string *version,
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *s)

{
  bool bVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  long lVar4;
  _Rb_tree_header *p_Var5;
  char *pcVar6;
  string m2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  p_Var3 = (s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(s->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    bVar1 = true;
    do {
      if (bVar1) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(section->_M_dataplus)._M_p,
                            section->_M_string_length);
        pcVar6 = ": ";
      }
      else {
        poVar2 = (ostream *)&std::cout;
        pcVar6 = ", ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,2);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      if (local_48 != 0) {
        lVar4 = 0;
        do {
          if (*(char *)((long)local_50 + lVar4) == '~') {
            *(undefined1 *)((long)local_50 + lVar4) = 0x5f;
          }
          lVar4 = lVar4 + 1;
        } while (local_48 != lVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"boost_",6);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,(version->_M_dataplus)._M_p,version->_M_string_length);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar1 = false;
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return;
}

Assistant:

static void output_requires( std::string const & section, std::string const & version, std::set< std::string > const & s )
{
    bool first = true;

    for( std::set< std::string >::const_iterator i = s.begin(); i != s.end(); ++i )
    {
        if( first )
        {
            std::cout << section << ": ";
            first = false;
        }
        else
        {
            std::cout << ", ";
        }

        std::string m2( *i );
        std::replace( m2.begin(), m2.end(), '~', '_' );

        std::cout << "boost_" << m2 << " = " << version;
    }
}